

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_value.cpp
# Opt level: O2

void test_object(void)

{
  bool bVar1;
  char cVar2;
  version vVar3;
  object *poVar4;
  long *plVar5;
  undefined8 *puVar6;
  wostream *pwVar7;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar8;
  initializer_list<mjs::string> __l;
  gc_heap_ptr<mjs::object> o;
  vector<mjs::string,_std::allocator<mjs::string>_> _l;
  string n;
  string n2;
  allocator_type local_b9;
  value _r;
  gc_heap_ptr_untyped local_90;
  gc_heap h;
  
  mjs::gc_heap::gc_heap(&h,0x100);
  _r.type_ = reference;
  _r._4_4_ = 0;
  _r.field_1.n_ = (double)anon_var_dwarf_41b5;
  mjs::string::string((string *)&_l,&h,(string_view *)&_r);
  n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
  mjs::gc_heap::make<mjs::object,mjs::string,decltype(nullptr)>
            ((gc_heap *)&o,(string *)&h,(void **)&_l);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&_l);
  poVar4 = (object *)mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
  mjs::object::enumerable_property_names(&_l,poVar4);
  _r._0_16_ = ZEXT816(0);
  _r.field_1._8_8_ = 0;
  bVar1 = std::operator!=(&_l,(vector<mjs::string,_std::allocator<mjs::string>_> *)&_r);
  if (bVar1) {
    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
    pwVar7 = std::operator<<(pwVar7," in ");
    pwVar7 = std::operator<<(pwVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar7 = std::operator<<(pwVar7,":");
    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x33);
    pwVar7 = std::operator<<(pwVar7,":\n");
    pwVar7 = std::operator<<(pwVar7,"o->enumerable_property_names()");
    pwVar7 = std::operator<<(pwVar7," != ");
    pwVar7 = std::operator<<(pwVar7,"(std::vector<string>{})");
    pwVar7 = std::operator<<(pwVar7,"\n");
    pbVar8 = operator<<(pwVar7,&_l);
    pwVar7 = std::operator<<(pbVar8," != ");
    pbVar8 = operator<<(pwVar7,(vector<mjs::string,_std::allocator<mjs::string>_> *)&_r);
    pwVar7 = std::operator<<(pbVar8,"\n");
    vVar3 = tested_version();
    pbVar8 = mjs::operator<<(pwVar7,vVar3);
    std::operator<<(pbVar8,"\n");
  }
  else {
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&_r);
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&_l);
    _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x4;
    _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)anon_var_dwarf_4201;
    mjs::string::string(&n,&h,(string_view *)&_l);
    _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)"foo";
    _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x3;
    mjs::string::string(&n2,&h,(string_view *)&_l);
    poVar4 = (object *)mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
    _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.super__Vector_impl_data
    ._0_16_ = mjs::string::view(&n);
    bVar1 = mjs::object::has_property(poVar4,(wstring_view *)&_l);
    if (bVar1) {
      pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
      pwVar7 = std::operator<<(pwVar7," in ");
      pwVar7 = std::operator<<(pwVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                              );
      pwVar7 = std::operator<<(pwVar7,":");
      pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x36);
      pwVar7 = std::operator<<(pwVar7,":\n");
      pwVar7 = std::operator<<(pwVar7,"!!(!o->has_property(n.view()))");
      pwVar7 = std::operator<<(pwVar7," != ");
      pwVar7 = std::operator<<(pwVar7,"true");
      pwVar7 = std::operator<<(pwVar7,"\n");
      pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
      pwVar7 = std::operator<<(pwVar7," != ");
      pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
      pwVar7 = std::operator<<(pwVar7,"\n");
      vVar3 = tested_version();
      pbVar8 = mjs::operator<<(pwVar7,vVar3);
      std::operator<<(pbVar8,"\n");
    }
    else {
      poVar4 = (object *)mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
      _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
      super__Vector_impl_data._0_16_ = mjs::string::view(&n2);
      bVar1 = mjs::object::has_property(poVar4,(wstring_view *)&_l);
      if (bVar1) {
        pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
        pwVar7 = std::operator<<(pwVar7," in ");
        pwVar7 = std::operator<<(pwVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                );
        pwVar7 = std::operator<<(pwVar7,":");
        pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x37);
        pwVar7 = std::operator<<(pwVar7,":\n");
        pwVar7 = std::operator<<(pwVar7,"!!(!o->has_property(n2.view()))");
        pwVar7 = std::operator<<(pwVar7," != ");
        pwVar7 = std::operator<<(pwVar7,"true");
        pwVar7 = std::operator<<(pwVar7,"\n");
        pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
        pwVar7 = std::operator<<(pwVar7," != ");
        pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
        pwVar7 = std::operator<<(pwVar7,"\n");
        vVar3 = tested_version();
        pbVar8 = mjs::operator<<(pwVar7,vVar3);
        std::operator<<(pbVar8,"\n");
      }
      else {
        poVar4 = (object *)mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
        _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
        super__Vector_impl_data._0_16_ = mjs::string::view(&n);
        bVar1 = mjs::object::can_put(poVar4,(wstring_view *)&_l);
        if (bVar1) {
          plVar5 = (long *)mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
          _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 3;
          _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x4045000000000000;
          (**(code **)(*plVar5 + 8))(plVar5,&n,&_l,0);
          mjs::value::~value((value *)&_l);
          poVar4 = (object *)mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
          _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._0_16_ = mjs::string::view(&n);
          bVar1 = mjs::object::has_property(poVar4,(wstring_view *)&_l);
          if (bVar1) {
            poVar4 = (object *)mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
            _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
            super__Vector_impl_data._0_16_ = mjs::string::view(&n);
            bVar1 = mjs::object::can_put(poVar4,(wstring_view *)&_l);
            if (bVar1) {
              plVar5 = (long *)mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
              mjs::value::value((value *)&_l,&n2);
              (**(code **)(*plVar5 + 8))(plVar5,&n2,&_l,7);
              mjs::value::~value((value *)&_l);
              poVar4 = (object *)mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
              _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
              super__Vector_impl_data._0_16_ = mjs::string::view(&n2);
              bVar1 = mjs::object::has_property(poVar4,(wstring_view *)&_l);
              if (bVar1) {
                poVar4 = (object *)mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
                _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                super__Vector_impl_data._0_16_ = mjs::string::view(&n2);
                bVar1 = mjs::object::can_put(poVar4,(wstring_view *)&_l);
                if (bVar1) {
                  pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
                  pwVar7 = std::operator<<(pwVar7," in ");
                  pwVar7 = std::operator<<(pwVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                          );
                  pwVar7 = std::operator<<(pwVar7,":");
                  pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x3e);
                  pwVar7 = std::operator<<(pwVar7,":\n");
                  pwVar7 = std::operator<<(pwVar7,"!!(!o->can_put(n2.view()))");
                  pwVar7 = std::operator<<(pwVar7," != ");
                  pwVar7 = std::operator<<(pwVar7,"true");
                  pwVar7 = std::operator<<(pwVar7,"\n");
                  pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                  pwVar7 = std::operator<<(pwVar7," != ");
                  pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                  pwVar7 = std::operator<<(pwVar7,"\n");
                  vVar3 = tested_version();
                  pbVar8 = mjs::operator<<(pwVar7,vVar3);
                  std::operator<<(pbVar8,"\n");
                }
                else {
                  puVar6 = (undefined8 *)mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped)
                  ;
                  _r._0_16_ = mjs::string::view(&n);
                  (**(code **)*puVar6)(&_l,puVar6,&_r);
                  _r.type_ = number;
                  _r.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
                       (gc_heap *)0x4045000000000000;
                  bVar1 = mjs::operator!=((value *)&_l,&_r);
                  if (bVar1) {
                    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
                    pwVar7 = std::operator<<(pwVar7," in ");
                    pwVar7 = std::operator<<(pwVar7,
                                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                            );
                    pwVar7 = std::operator<<(pwVar7,":");
                    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x3f);
                    pwVar7 = std::operator<<(pwVar7,":\n");
                    pwVar7 = std::operator<<(pwVar7,"o->get(n.view())");
                    pwVar7 = std::operator<<(pwVar7," != ");
                    pwVar7 = std::operator<<(pwVar7,"value{42.0}");
                    pwVar7 = std::operator<<(pwVar7,"\n");
                    pbVar8 = operator<<(pwVar7,(value *)&_l);
                    pwVar7 = std::operator<<(pbVar8," != ");
                    pbVar8 = operator<<(pwVar7,&_r);
                    pwVar7 = std::operator<<(pbVar8,"\n");
                    vVar3 = tested_version();
                    pbVar8 = mjs::operator<<(pwVar7,vVar3);
                    std::operator<<(pbVar8,"\n");
                  }
                  else {
                    mjs::value::~value(&_r);
                    mjs::value::~value((value *)&_l);
                    puVar6 = (undefined8 *)
                             mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
                    _r._0_16_ = mjs::string::view(&n2);
                    (**(code **)*puVar6)(&_l,puVar6,&_r);
                    mjs::value::value(&_r,&n2);
                    bVar1 = mjs::operator!=((value *)&_l,&_r);
                    if (bVar1) {
                      pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
                      pwVar7 = std::operator<<(pwVar7," in ");
                      pwVar7 = std::operator<<(pwVar7,
                                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                              );
                      pwVar7 = std::operator<<(pwVar7,":");
                      pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x40);
                      pwVar7 = std::operator<<(pwVar7,":\n");
                      pwVar7 = std::operator<<(pwVar7,"o->get(n2.view())");
                      pwVar7 = std::operator<<(pwVar7," != ");
                      pwVar7 = std::operator<<(pwVar7,"value{n2}");
                      pwVar7 = std::operator<<(pwVar7,"\n");
                      pbVar8 = operator<<(pwVar7,(value *)&_l);
                      pwVar7 = std::operator<<(pbVar8," != ");
                      pbVar8 = operator<<(pwVar7,&_r);
                      pwVar7 = std::operator<<(pbVar8,"\n");
                      vVar3 = tested_version();
                      pbVar8 = mjs::operator<<(pwVar7,vVar3);
                      std::operator<<(pbVar8,"\n");
                    }
                    else {
                      mjs::value::~value(&_r);
                      mjs::value::~value((value *)&_l);
                      poVar4 = (object *)mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped)
                      ;
                      mjs::object::enumerable_property_names(&_l,poVar4);
                      mjs::gc_heap_ptr_untyped::gc_heap_ptr_untyped
                                (&local_90,(gc_heap_ptr_untyped *)&n);
                      __l._M_len = 1;
                      __l._M_array = (iterator)&local_90;
                      std::vector<mjs::string,_std::allocator<mjs::string>_>::vector
                                ((vector<mjs::string,_std::allocator<mjs::string>_> *)&_r,__l,
                                 &local_b9);
                      mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
                      bVar1 = std::operator!=(&_l,(vector<mjs::string,_std::allocator<mjs::string>_>
                                                   *)&_r);
                      if (bVar1) {
                        pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
                        pwVar7 = std::operator<<(pwVar7," in ");
                        pwVar7 = std::operator<<(pwVar7,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                );
                        pwVar7 = std::operator<<(pwVar7,":");
                        pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x41);
                        pwVar7 = std::operator<<(pwVar7,":\n");
                        pwVar7 = std::operator<<(pwVar7,"o->enumerable_property_names()");
                        pwVar7 = std::operator<<(pwVar7," != ");
                        pwVar7 = std::operator<<(pwVar7,"(std::vector<string>{n})");
                        pwVar7 = std::operator<<(pwVar7,"\n");
                        pbVar8 = operator<<(pwVar7,&_l);
                        pwVar7 = std::operator<<(pbVar8," != ");
                        pbVar8 = operator<<(pwVar7,(
                                                  vector<mjs::string,_std::allocator<mjs::string>_>
                                                  *)&_r);
                        pwVar7 = std::operator<<(pbVar8,"\n");
                        vVar3 = tested_version();
                        pbVar8 = mjs::operator<<(pwVar7,vVar3);
                        std::operator<<(pbVar8,"\n");
                      }
                      else {
                        std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
                                  ((vector<mjs::string,_std::allocator<mjs::string>_> *)&_r);
                        std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&_l);
                        plVar5 = (long *)mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped)
                        ;
                        mjs::value::value((value *)&_l,&n);
                        (**(code **)(*plVar5 + 8))(plVar5,&n,&_l,0);
                        mjs::value::~value((value *)&_l);
                        puVar6 = (undefined8 *)
                                 mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
                        _r._0_16_ = mjs::string::view(&n);
                        (**(code **)*puVar6)(&_l,puVar6,&_r);
                        mjs::value::value(&_r,&n);
                        bVar1 = mjs::operator!=((value *)&_l,&_r);
                        if (bVar1) {
                          pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
                          pwVar7 = std::operator<<(pwVar7," in ");
                          pwVar7 = std::operator<<(pwVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                          pwVar7 = std::operator<<(pwVar7,":");
                          pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x43);
                          pwVar7 = std::operator<<(pwVar7,":\n");
                          pwVar7 = std::operator<<(pwVar7,"o->get(n.view())");
                          pwVar7 = std::operator<<(pwVar7," != ");
                          pwVar7 = std::operator<<(pwVar7,"value{n}");
                          pwVar7 = std::operator<<(pwVar7,"\n");
                          pbVar8 = operator<<(pwVar7,(value *)&_l);
                          pwVar7 = std::operator<<(pbVar8," != ");
                          pbVar8 = operator<<(pwVar7,&_r);
                          pwVar7 = std::operator<<(pbVar8,"\n");
                          vVar3 = tested_version();
                          pbVar8 = mjs::operator<<(pwVar7,vVar3);
                          std::operator<<(pbVar8,"\n");
                        }
                        else {
                          mjs::value::~value(&_r);
                          mjs::value::~value((value *)&_l);
                          plVar5 = (long *)mjs::gc_heap_ptr_untyped::get
                                                     (&o.super_gc_heap_ptr_untyped);
                          _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                          super__Vector_impl_data._0_16_ = mjs::string::view(&n);
                          cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5);
                          if (cVar2 == '\0') {
                            pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
                            pwVar7 = std::operator<<(pwVar7," in ");
                            pwVar7 = std::operator<<(pwVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                            pwVar7 = std::operator<<(pwVar7,":");
                            pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x44);
                            pwVar7 = std::operator<<(pwVar7,":\n");
                            pwVar7 = std::operator<<(pwVar7,"!!(o->delete_property(n.view()))");
                            pwVar7 = std::operator<<(pwVar7," != ");
                            pwVar7 = std::operator<<(pwVar7,"true");
                            pwVar7 = std::operator<<(pwVar7,"\n");
                            pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                            pwVar7 = std::operator<<(pwVar7," != ");
                            pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                            pwVar7 = std::operator<<(pwVar7,"\n");
                            vVar3 = tested_version();
                            pbVar8 = mjs::operator<<(pwVar7,vVar3);
                            std::operator<<(pbVar8,"\n");
                          }
                          else {
                            poVar4 = (object *)
                                     mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
                            _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl
                            .super__Vector_impl_data._0_16_ = mjs::string::view(&n);
                            bVar1 = mjs::object::has_property(poVar4,(wstring_view *)&_l);
                            if (bVar1) {
                              pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
                              pwVar7 = std::operator<<(pwVar7," in ");
                              pwVar7 = std::operator<<(pwVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                              pwVar7 = std::operator<<(pwVar7,":");
                              pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x45);
                              pwVar7 = std::operator<<(pwVar7,":\n");
                              pwVar7 = std::operator<<(pwVar7,"!!(!o->has_property(n.view()))");
                              pwVar7 = std::operator<<(pwVar7," != ");
                              pwVar7 = std::operator<<(pwVar7,"true");
                              pwVar7 = std::operator<<(pwVar7,"\n");
                              pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                              pwVar7 = std::operator<<(pwVar7," != ");
                              pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                              pwVar7 = std::operator<<(pwVar7,"\n");
                              vVar3 = tested_version();
                              pbVar8 = mjs::operator<<(pwVar7,vVar3);
                              std::operator<<(pbVar8,"\n");
                            }
                            else {
                              poVar4 = (object *)
                                       mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
                              _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                              _M_impl.super__Vector_impl_data._0_16_ = mjs::string::view(&n);
                              bVar1 = mjs::object::can_put(poVar4,(wstring_view *)&_l);
                              if (bVar1) {
                                poVar4 = (object *)
                                         mjs::gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped)
                                ;
                                _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                                _M_impl.super__Vector_impl_data._0_16_ = mjs::string::view(&n2);
                                bVar1 = mjs::object::has_property(poVar4,(wstring_view *)&_l);
                                if (bVar1) {
                                  poVar4 = (object *)
                                           mjs::gc_heap_ptr_untyped::get
                                                     (&o.super_gc_heap_ptr_untyped);
                                  _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                                  _M_impl.super__Vector_impl_data._0_16_ = mjs::string::view(&n2);
                                  bVar1 = mjs::object::can_put(poVar4,(wstring_view *)&_l);
                                  if (bVar1) {
                                    pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
                                    pwVar7 = std::operator<<(pwVar7," in ");
                                    pwVar7 = std::operator<<(pwVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                    pwVar7 = std::operator<<(pwVar7,":");
                                    pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x48);
                                    pwVar7 = std::operator<<(pwVar7,":\n");
                                    pwVar7 = std::operator<<(pwVar7,"!!(!o->can_put(n2.view()))");
                                    pwVar7 = std::operator<<(pwVar7," != ");
                                    pwVar7 = std::operator<<(pwVar7,"true");
                                    pwVar7 = std::operator<<(pwVar7,"\n");
                                    pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                                    pwVar7 = std::operator<<(pwVar7," != ");
                                    pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                                    pwVar7 = std::operator<<(pwVar7,"\n");
                                    vVar3 = tested_version();
                                    pbVar8 = mjs::operator<<(pwVar7,vVar3);
                                    std::operator<<(pbVar8,"\n");
                                  }
                                  else {
                                    plVar5 = (long *)mjs::gc_heap_ptr_untyped::get
                                                               (&o.super_gc_heap_ptr_untyped);
                                    _l.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>
                                    ._M_impl.super__Vector_impl_data._0_16_ = mjs::string::view(&n2)
                                    ;
                                    cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5);
                                    if (cVar2 == '\x01') {
                                      pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object"
                                                              );
                                      pwVar7 = std::operator<<(pwVar7," in ");
                                      pwVar7 = std::operator<<(pwVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                      pwVar7 = std::operator<<(pwVar7,":");
                                      pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x49);
                                      pwVar7 = std::operator<<(pwVar7,":\n");
                                      pwVar7 = std::operator<<(pwVar7,
                                                  "!!(!o->delete_property(n2.view()))");
                                      pwVar7 = std::operator<<(pwVar7," != ");
                                      pwVar7 = std::operator<<(pwVar7,"true");
                                      pwVar7 = std::operator<<(pwVar7,"\n");
                                      pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                                      pwVar7 = std::operator<<(pwVar7," != ");
                                      pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                                      pwVar7 = std::operator<<(pwVar7,"\n");
                                      vVar3 = tested_version();
                                      pbVar8 = mjs::operator<<(pwVar7,vVar3);
                                      std::operator<<(pbVar8,"\n");
                                    }
                                    else {
                                      poVar4 = (object *)
                                               mjs::gc_heap_ptr_untyped::get
                                                         (&o.super_gc_heap_ptr_untyped);
                                      _l.
                                      super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                                      _M_impl.super__Vector_impl_data._0_16_ =
                                           mjs::string::view(&n2);
                                      bVar1 = mjs::object::has_property(poVar4,(wstring_view *)&_l);
                                      if (bVar1) {
                                        puVar6 = (undefined8 *)
                                                 mjs::gc_heap_ptr_untyped::get
                                                           (&o.super_gc_heap_ptr_untyped);
                                        _r._0_16_ = mjs::string::view(&n2);
                                        (**(code **)*puVar6)(&_l,puVar6,&_r);
                                        mjs::value::value(&_r,&n2);
                                        bVar1 = mjs::operator!=((value *)&_l,&_r);
                                        if (bVar1) {
                                          pwVar7 = std::operator<<((wostream *)&std::wcerr,
                                                                   "test_object");
                                          pwVar7 = std::operator<<(pwVar7," in ");
                                          pwVar7 = std::operator<<(pwVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                          pwVar7 = std::operator<<(pwVar7,":");
                                          pwVar7 = (wostream *)
                                                   std::wostream::operator<<(pwVar7,0x4b);
                                          pwVar7 = std::operator<<(pwVar7,":\n");
                                          pwVar7 = std::operator<<(pwVar7,"o->get(n2.view())");
                                          pwVar7 = std::operator<<(pwVar7," != ");
                                          pwVar7 = std::operator<<(pwVar7,"value{n2}");
                                          pwVar7 = std::operator<<(pwVar7,"\n");
                                          pbVar8 = operator<<(pwVar7,(value *)&_l);
                                          pwVar7 = std::operator<<(pbVar8," != ");
                                          pbVar8 = operator<<(pwVar7,&_r);
                                          pwVar7 = std::operator<<(pbVar8,"\n");
                                          vVar3 = tested_version();
                                          pbVar8 = mjs::operator<<(pwVar7,vVar3);
                                          std::operator<<(pbVar8,"\n");
                                        }
                                        else {
                                          mjs::value::~value(&_r);
                                          mjs::value::~value((value *)&_l);
                                          poVar4 = (object *)
                                                   mjs::gc_heap_ptr_untyped::get
                                                             (&o.super_gc_heap_ptr_untyped);
                                          mjs::object::enumerable_property_names(&_l,poVar4);
                                          _r._0_16_ = ZEXT816(0);
                                          _r.field_1._8_8_ = 0;
                                          bVar1 = std::operator!=(&_l,(
                                                  vector<mjs::string,_std::allocator<mjs::string>_>
                                                  *)&_r);
                                          if (!bVar1) {
                                            std::vector<mjs::string,_std::allocator<mjs::string>_>::
                                            ~vector((
                                                  vector<mjs::string,_std::allocator<mjs::string>_>
                                                  *)&_r);
                                            std::vector<mjs::string,_std::allocator<mjs::string>_>::
                                            ~vector(&_l);
                                            mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                      ((gc_heap_ptr_untyped *)&n2);
                                            mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                      ((gc_heap_ptr_untyped *)&n);
                                            mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                      (&o.super_gc_heap_ptr_untyped);
                                            mjs::gc_heap::garbage_collect(&h);
                                            if ((int)(((ulong)(h.alloc_context_.next_free_ -
                                                              h.alloc_context_.start_) * 100) /
                                                     (ulong)(h.alloc_context_.capacity_ -
                                                            h.alloc_context_.start_)) == 0) {
                                              mjs::gc_heap::~gc_heap(&h);
                                              return;
                                            }
                                            __assert_fail("h.use_percentage() == 0",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  ,0x50,"void test_object()");
                                          }
                                          pwVar7 = std::operator<<((wostream *)&std::wcerr,
                                                                   "test_object");
                                          pwVar7 = std::operator<<(pwVar7," in ");
                                          pwVar7 = std::operator<<(pwVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                          pwVar7 = std::operator<<(pwVar7,":");
                                          pwVar7 = (wostream *)
                                                   std::wostream::operator<<(pwVar7,0x4c);
                                          pwVar7 = std::operator<<(pwVar7,":\n");
                                          pwVar7 = std::operator<<(pwVar7,
                                                  "o->enumerable_property_names()");
                                          pwVar7 = std::operator<<(pwVar7," != ");
                                          pwVar7 = std::operator<<(pwVar7,"(std::vector<string>{})")
                                          ;
                                          pwVar7 = std::operator<<(pwVar7,"\n");
                                          pbVar8 = operator<<(pwVar7,&_l);
                                          pwVar7 = std::operator<<(pbVar8," != ");
                                          pbVar8 = operator<<(pwVar7,(
                                                  vector<mjs::string,_std::allocator<mjs::string>_>
                                                  *)&_r);
                                          pwVar7 = std::operator<<(pbVar8,"\n");
                                          vVar3 = tested_version();
                                          pbVar8 = mjs::operator<<(pwVar7,vVar3);
                                          std::operator<<(pbVar8,"\n");
                                        }
                                      }
                                      else {
                                        pwVar7 = std::operator<<((wostream *)&std::wcerr,
                                                                 "test_object");
                                        pwVar7 = std::operator<<(pwVar7," in ");
                                        pwVar7 = std::operator<<(pwVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                        pwVar7 = std::operator<<(pwVar7,":");
                                        pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x4a);
                                        pwVar7 = std::operator<<(pwVar7,":\n");
                                        pwVar7 = std::operator<<(pwVar7,
                                                  "!!(o->has_property(n2.view()))");
                                        pwVar7 = std::operator<<(pwVar7," != ");
                                        pwVar7 = std::operator<<(pwVar7,"true");
                                        pwVar7 = std::operator<<(pwVar7,"\n");
                                        pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                                        pwVar7 = std::operator<<(pwVar7," != ");
                                        pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                                        pwVar7 = std::operator<<(pwVar7,"\n");
                                        vVar3 = tested_version();
                                        pbVar8 = mjs::operator<<(pwVar7,vVar3);
                                        std::operator<<(pbVar8,"\n");
                                      }
                                    }
                                  }
                                }
                                else {
                                  pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
                                  pwVar7 = std::operator<<(pwVar7," in ");
                                  pwVar7 = std::operator<<(pwVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                  pwVar7 = std::operator<<(pwVar7,":");
                                  pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x47);
                                  pwVar7 = std::operator<<(pwVar7,":\n");
                                  pwVar7 = std::operator<<(pwVar7,"!!(o->has_property(n2.view()))");
                                  pwVar7 = std::operator<<(pwVar7," != ");
                                  pwVar7 = std::operator<<(pwVar7,"true");
                                  pwVar7 = std::operator<<(pwVar7,"\n");
                                  pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                                  pwVar7 = std::operator<<(pwVar7," != ");
                                  pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                                  pwVar7 = std::operator<<(pwVar7,"\n");
                                  vVar3 = tested_version();
                                  pbVar8 = mjs::operator<<(pwVar7,vVar3);
                                  std::operator<<(pbVar8,"\n");
                                }
                              }
                              else {
                                pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
                                pwVar7 = std::operator<<(pwVar7," in ");
                                pwVar7 = std::operator<<(pwVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                pwVar7 = std::operator<<(pwVar7,":");
                                pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x46);
                                pwVar7 = std::operator<<(pwVar7,":\n");
                                pwVar7 = std::operator<<(pwVar7,"!!(o->can_put(n.view()))");
                                pwVar7 = std::operator<<(pwVar7," != ");
                                pwVar7 = std::operator<<(pwVar7,"true");
                                pwVar7 = std::operator<<(pwVar7,"\n");
                                pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                                pwVar7 = std::operator<<(pwVar7," != ");
                                pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                                pwVar7 = std::operator<<(pwVar7,"\n");
                                vVar3 = tested_version();
                                pbVar8 = mjs::operator<<(pwVar7,vVar3);
                                std::operator<<(pbVar8,"\n");
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
                pwVar7 = std::operator<<(pwVar7," in ");
                pwVar7 = std::operator<<(pwVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                        );
                pwVar7 = std::operator<<(pwVar7,":");
                pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x3d);
                pwVar7 = std::operator<<(pwVar7,":\n");
                pwVar7 = std::operator<<(pwVar7,"!!(o->has_property(n2.view()))");
                pwVar7 = std::operator<<(pwVar7," != ");
                pwVar7 = std::operator<<(pwVar7,"true");
                pwVar7 = std::operator<<(pwVar7,"\n");
                pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                pwVar7 = std::operator<<(pwVar7," != ");
                pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
                pwVar7 = std::operator<<(pwVar7,"\n");
                vVar3 = tested_version();
                pbVar8 = mjs::operator<<(pwVar7,vVar3);
                std::operator<<(pbVar8,"\n");
              }
            }
            else {
              pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
              pwVar7 = std::operator<<(pwVar7," in ");
              pwVar7 = std::operator<<(pwVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                      );
              pwVar7 = std::operator<<(pwVar7,":");
              pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x3b);
              pwVar7 = std::operator<<(pwVar7,":\n");
              pwVar7 = std::operator<<(pwVar7,"!!(o->can_put(n.view()))");
              pwVar7 = std::operator<<(pwVar7," != ");
              pwVar7 = std::operator<<(pwVar7,"true");
              pwVar7 = std::operator<<(pwVar7,"\n");
              pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
              pwVar7 = std::operator<<(pwVar7," != ");
              pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
              pwVar7 = std::operator<<(pwVar7,"\n");
              vVar3 = tested_version();
              pbVar8 = mjs::operator<<(pwVar7,vVar3);
              std::operator<<(pbVar8,"\n");
            }
          }
          else {
            pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
            pwVar7 = std::operator<<(pwVar7," in ");
            pwVar7 = std::operator<<(pwVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                    );
            pwVar7 = std::operator<<(pwVar7,":");
            pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x3a);
            pwVar7 = std::operator<<(pwVar7,":\n");
            pwVar7 = std::operator<<(pwVar7,"!!(o->has_property(n.view()))");
            pwVar7 = std::operator<<(pwVar7," != ");
            pwVar7 = std::operator<<(pwVar7,"true");
            pwVar7 = std::operator<<(pwVar7,"\n");
            pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
            pwVar7 = std::operator<<(pwVar7," != ");
            pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
            pwVar7 = std::operator<<(pwVar7,"\n");
            vVar3 = tested_version();
            pbVar8 = mjs::operator<<(pwVar7,vVar3);
            std::operator<<(pbVar8,"\n");
          }
        }
        else {
          pwVar7 = std::operator<<((wostream *)&std::wcerr,"test_object");
          pwVar7 = std::operator<<(pwVar7," in ");
          pwVar7 = std::operator<<(pwVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                  );
          pwVar7 = std::operator<<(pwVar7,":");
          pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,0x38);
          pwVar7 = std::operator<<(pwVar7,":\n");
          pwVar7 = std::operator<<(pwVar7,"!!(o->can_put(n.view()))");
          pwVar7 = std::operator<<(pwVar7," != ");
          pwVar7 = std::operator<<(pwVar7,"true");
          pwVar7 = std::operator<<(pwVar7,"\n");
          pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
          pwVar7 = std::operator<<(pwVar7," != ");
          pwVar7 = std::wostream::_M_insert<bool>(SUB81(pwVar7,0));
          pwVar7 = std::operator<<(pwVar7,"\n");
          vVar3 = tested_version();
          pbVar8 = mjs::operator<<(pwVar7,vVar3);
          std::operator<<(pbVar8,"\n");
        }
      }
    }
  }
  abort();
}

Assistant:

void test_object() {
    gc_heap h{1<<8};
    {
        auto o = h.make<object>(string{h, "Object"}, nullptr);
        REQUIRE_EQ(o->enumerable_property_names(), (std::vector<string>{}));
        const auto n = string{h,"test"};
        const auto n2 = string{h,"foo"};
        REQUIRE(!o->has_property(n.view()));
        REQUIRE(!o->has_property(n2.view()));
        REQUIRE(o->can_put(n.view()));
        o->put(n, value{42.0});
        REQUIRE(o->has_property(n.view()));
        REQUIRE(o->can_put(n.view()));
        o->put(n2, value{n2}, property_attribute::dont_enum | property_attribute::dont_delete | property_attribute::read_only);
        REQUIRE(o->has_property(n2.view()));
        REQUIRE(!o->can_put(n2.view()));
        REQUIRE_EQ(o->get(n.view()), value{42.0});
        REQUIRE_EQ(o->get(n2.view()), value{n2});
        REQUIRE_EQ(o->enumerable_property_names(), (std::vector<string>{n}));
        o->put(n, value{n});
        REQUIRE_EQ(o->get(n.view()), value{n});
        REQUIRE(o->delete_property(n.view()));
        REQUIRE(!o->has_property(n.view()));
        REQUIRE(o->can_put(n.view()));
        REQUIRE(o->has_property(n2.view()));
        REQUIRE(!o->can_put(n2.view()));
        REQUIRE(!o->delete_property(n2.view()));
        REQUIRE(o->has_property(n2.view()));
        REQUIRE_EQ(o->get(n2.view()), value{n2});
        REQUIRE_EQ(o->enumerable_property_names(), (std::vector<string>{}));
    }

    h.garbage_collect();
    assert(h.use_percentage() == 0);
}